

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O3

ssize_t ExprEval::Operator::BaseSpecification::read(int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  istream *piVar2;
  size_type __new_size;
  ssize_t sVar3;
  Exception *this;
  byte bVar4;
  byte bVar5;
  undefined4 in_register_0000003c;
  string *psVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  string line;
  string token;
  string expression;
  string symbol;
  stringstream stream;
  ifstream file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  char *local_460;
  long local_458;
  char local_450 [16];
  char *local_440;
  undefined8 local_438;
  char local_430 [16];
  string local_420;
  string local_400;
  string local_3e0;
  long local_3c0 [2];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)CONCAT44(in_register_0000003c,__fd),_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    this = (Exception *)__cxa_allocate_exception(0x30);
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3e0,"Cannot open the specification file!","");
    Engine::Exception::Exception(this,File,&local_3e0);
    __cxa_throw(this,&Engine::Exception::typeinfo,Engine::Exception::~Exception);
  }
  local_460 = local_450;
  local_458 = 0;
  local_450[0] = '\0';
  local_440 = local_430;
  local_438 = 0;
  local_430[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  local_420._M_string_length = 0;
  local_420.field_2._M_local_buf[0] = '\0';
LAB_0010ae3b:
  cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238);
  piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_238,(string *)&local_460,cVar1);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
    std::ifstream::close();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
    if (local_440 != local_430) {
      operator_delete(local_440);
    }
    if (local_460 != local_450) {
      operator_delete(local_460);
    }
    sVar3 = std::ifstream::~ifstream(local_238);
    return sVar3;
  }
  std::ios::clear((int)*(undefined8 *)(local_3c0[0] + -0x18) + (int)(stringstream *)local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_460,local_458);
  bVar4 = 0;
LAB_0010aea5:
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3c0,(string *)&local_440,',');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    bVar5 = bVar4 + 1;
    psVar6 = &local_400;
    if (bVar4 != 0) {
      if (bVar4 == 1) {
        __new_size = atol(local_440);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&local_478,__new_size);
        bVar4 = bVar5;
        goto LAB_0010aea5;
      }
      psVar6 = &local_420;
      if (2 < bVar5) {
        if ((ulong)(uint)bVar5 <=
            ((long)local_478.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_478.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) + 2U) {
          psVar6 = local_478.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (bVar5 - 3);
        }
      }
    }
    std::__cxx11::string::_M_assign((string *)psVar6);
    bVar4 = bVar5;
  } while( true );
  add_custom_operator(&local_400,&local_478,&local_420);
  goto LAB_0010ae3b;
}

Assistant:

void BaseSpecification::read(const std::string& file_path){
            auto table = custom_operator_table;
            std::ifstream file(file_path);

            if(!file){
                throw Engine::Exception(Engine::Error::File, "Cannot open the specification file!");
            }

            std::string line;
            std::string token;
            std::stringstream stream;
            std::string symbol;
            std::vector<std::string> variables;
            std::string expression;
            while(std::getline(file, line)){
                unsigned char count = 0;
                stream.clear();
                stream << line;
                while(std::getline(stream, token, ',')){
                    ++count;
                    if(count == 1){
                        symbol = token;
                    }
                    else if(count == 2){
                        variables.resize(atol(token.c_str()));
                    }
                    else if(count > 2 && count <= variables.size() + 2){
                        variables[count-3] = token;
                    }
                    else{
                        expression = token;
                    }
                }
                add_custom_operator(symbol, variables, expression);
            }

            file.close();
        }